

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_stream.c
# Opt level: O0

mk_channel * mk_channel_new(int type,int fd)

{
  mk_channel *channel;
  int fd_local;
  int type_local;
  
  _fd_local = (mk_channel *)mk_mem_alloc(0x38);
  if (_fd_local == (mk_channel *)0x0) {
    _fd_local = (mk_channel *)0x0;
  }
  else {
    _fd_local->type = type;
    _fd_local->fd = fd;
    _fd_local->status = 0;
    mk_list_init(&_fd_local->streams);
  }
  return _fd_local;
}

Assistant:

struct mk_channel *mk_channel_new(int type, int fd)
{
    struct mk_channel *channel;

    channel = mk_mem_alloc(sizeof(struct mk_channel));
    if (!channel) {
        return NULL;
    }
    channel->type   = type;
    channel->fd     = fd;
    channel->status = MK_CHANNEL_OK;
    mk_list_init(&channel->streams);

    return channel;
}